

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_symlink_dir.c
# Opt level: O1

void test_symlink_dir(void)

{
  wchar_t wVar1;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                  ,L'$',L'\0');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'&',"source",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'\'',"source/file",L'ǭ',L'\xffffffff',"a");
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'(',"source/file2",L'ǭ',L'\xffffffff',"ab");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L')',"source/dir",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'*',"source/dir/d",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'+',"source/dir/f",L'ǭ',L'\xffffffff',"abc");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L',',"source/dir2",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'-',"source/dir2/d2",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'.',"source/dir2/f2",L'ǭ',L'\xffffffff',"abcd");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'/',"source/dir3",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'0',"source/dir3/d3",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'1',"source/dir3/f3",L'ǭ',L'\xffffffff',"abcde");
  wVar1 = systemf("%s -cf test.tar -C source dir dir2 dir3 file file2",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'5',0,"0",(long)wVar1,
                      "systemf(\"%s -cf test.tar -C source dir dir2 dir3 file file2\", testprog)",
                      (void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L':',"dest1",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'<',"dest1/real_dir",L'ǭ');
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'B');
    test_skipping("some symlink checks");
  }
  else {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'>',"dest1/dir","real_dir");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'@',"dest1/dir2","real_dir2");
  }
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'E',"dest1/non_dir3",L'ǭ',L'\xffffffff',"abcdef");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'G',"dest1/dir3","non_dir3");
  }
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'I',"dest1/real_file",L'ǭ',L'\xffffffff',"abcdefg");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'K',"dest1/file","real_file");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'M',"dest1/file2","real_file2");
  }
  wVar1 = systemf("%s -xf test.tar -C dest1",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'O',0,"0",(long)wVar1,"systemf(\"%s -xf test.tar -C dest1\", testprog)",
                      (void *)0x0);
  failure("symlink to dir was followed when it shouldn\'t be");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'S',"dest1/dir",L'\xffffffff');
  failure("Broken symlink wasn\'t replaced with dir");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'V',"dest1/dir2",L'\xffffffff');
  failure("Symlink to non-dir wasn\'t replaced with dir");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'Y',"dest1/dir3",L'\xffffffff');
  failure("Symlink to existing file should be replaced");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'\\',"dest1/file",L'\xffffffff');
  failure("Symlink to non-existing file should be replaced");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'_',"dest1/file2",L'\xffffffff');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'd',"dest2",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'f',"dest2/real_dir",L'ǭ');
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'h',"dest2/dir","real_dir");
  }
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'k',"dest2/dir2","real_dir2");
  }
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'm',"dest2/non_dir3",L'ǭ',L'\xffffffff',"abcdefgh");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'o',"dest2/dir3","non_dir3");
  }
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'q',"dest2/real_file",L'ǭ',L'\xffffffff',"abcdefghi");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L's',"dest2/file","real_file");
  }
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'v',"dest2/file2","real_file2");
  }
  wVar1 = systemf("%s -xPf test.tar -C dest2",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'w',0,"0",(long)wVar1,"systemf(\"%s -xPf test.tar -C dest2\", testprog)",
                      (void *)0x0);
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
               ,L'{',"dest2/dir","real_dir");
    assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                     ,L'|',"dest2/real_dir",L'\xffffffff');
  }
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'\x80',"dest2/dir/d",L'\xffffffff');
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'\x81',"dest2/dir/f",L'\xffffffff');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                      ,L'\x82',"dest2/dir/f",3);
  failure("Broken symlink wasn\'t replaced with dir");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'\x85',"dest2/dir2",L'\xffffffff');
  failure("Symlink to non-dir wasn\'t replaced with dir");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'\x88',"dest2/dir3",L'\xffffffff');
  failure("Symlink to existing file should be removed");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'\x8c',"dest2/file",L'\xffffffff');
  failure("Symlink to non-existing file should be removed");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_symlink_dir.c"
                   ,L'\x8f',"dest2/file2",L'\xffffffff');
  return;
}

Assistant:

DEFINE_TEST(test_symlink_dir)
{
	assertUmask(0);

	assertMakeDir("source", 0755);
	assertMakeFile("source/file", 0755, "a");
	assertMakeFile("source/file2", 0755, "ab");
	assertMakeDir("source/dir", 0755);
	assertMakeDir("source/dir/d", 0755);
	assertMakeFile("source/dir/f", 0755, "abc");
	assertMakeDir("source/dir2", 0755);
	assertMakeDir("source/dir2/d2", 0755);
	assertMakeFile("source/dir2/f2", 0755, "abcd");
	assertMakeDir("source/dir3", 0755);
	assertMakeDir("source/dir3/d3", 0755);
	assertMakeFile("source/dir3/f3", 0755, "abcde");

	assertEqualInt(0,
	    systemf("%s -cf test.tar -C source dir dir2 dir3 file file2",
		testprog));

	/*
	 * Extract with -x and without -P.
	 */
	assertMakeDir("dest1", 0755);
	/* "dir" is a symlink to an existing "dest1/real_dir" */
	assertMakeDir("dest1/real_dir", 0755);
	if (canSymlink()) {
		assertMakeSymlink("dest1/dir", "real_dir");
		/* "dir2" is a symlink to a non-existing "real_dir2" */
		assertMakeSymlink("dest1/dir2", "real_dir2");
	} else {
		skipping("some symlink checks");
	}
	/* "dir3" is a symlink to an existing "non_dir3" */
	assertMakeFile("dest1/non_dir3", 0755, "abcdef");
	if (canSymlink())
		assertMakeSymlink("dest1/dir3", "non_dir3");
	/* "file" is a symlink to existing "real_file" */
	assertMakeFile("dest1/real_file", 0755, "abcdefg");
	if (canSymlink()) {
		assertMakeSymlink("dest1/file", "real_file");
		/* "file2" is a symlink to non-existing "real_file2" */
		assertMakeSymlink("dest1/file2", "real_file2");
	}
	assertEqualInt(0, systemf("%s -xf test.tar -C dest1", testprog));

	/* dest1/dir symlink should be replaced */
	failure("symlink to dir was followed when it shouldn't be");
	assertIsDir("dest1/dir", -1);
	/* dest1/dir2 symlink should be replaced */
	failure("Broken symlink wasn't replaced with dir");
	assertIsDir("dest1/dir2", -1);
	/* dest1/dir3 symlink should be replaced */
	failure("Symlink to non-dir wasn't replaced with dir");
	assertIsDir("dest1/dir3", -1);
	/* dest1/file symlink should be replaced */
	failure("Symlink to existing file should be replaced");
	assertIsReg("dest1/file", -1);
	/* dest1/file2 symlink should be replaced */
	failure("Symlink to non-existing file should be replaced");
	assertIsReg("dest1/file2", -1);

	/*
	 * Extract with both -x and -P
	 */
	assertMakeDir("dest2", 0755);
	/* "dir" is a symlink to existing "real_dir" */
	assertMakeDir("dest2/real_dir", 0755);
	if (canSymlink())
		assertMakeSymlink("dest2/dir", "real_dir");
	/* "dir2" is a symlink to a non-existing "real_dir2" */
	if (canSymlink())
		assertMakeSymlink("dest2/dir2", "real_dir2");
	/* "dir3" is a symlink to an existing "non_dir3" */
	assertMakeFile("dest2/non_dir3", 0755, "abcdefgh");
	if (canSymlink())
		assertMakeSymlink("dest2/dir3", "non_dir3");
	/* "file" is a symlink to existing "real_file" */
	assertMakeFile("dest2/real_file", 0755, "abcdefghi");
	if (canSymlink())
		assertMakeSymlink("dest2/file", "real_file");
	/* "file2" is a symlink to non-existing "real_file2" */
	if (canSymlink())
		assertMakeSymlink("dest2/file2", "real_file2");
	assertEqualInt(0, systemf("%s -xPf test.tar -C dest2", testprog));

	/* dest2/dir symlink should be followed */
	if (canSymlink()) {
		assertIsSymlink("dest2/dir", "real_dir");
		assertIsDir("dest2/real_dir", -1);
	}

	/* Contents of 'dir' should be restored */
	assertIsDir("dest2/dir/d", -1);
	assertIsReg("dest2/dir/f", -1);
	assertFileSize("dest2/dir/f", 3);
	/* dest2/dir2 symlink should be removed */
	failure("Broken symlink wasn't replaced with dir");
	assertIsDir("dest2/dir2", -1);
	/* dest2/dir3 symlink should be removed */
	failure("Symlink to non-dir wasn't replaced with dir");
	assertIsDir("dest2/dir3", -1);
	/* dest2/file symlink should be removed;
	 * even -P shouldn't follow symlinks for files */
	failure("Symlink to existing file should be removed");
	assertIsReg("dest2/file", -1);
	/* dest2/file2 symlink should be removed */
	failure("Symlink to non-existing file should be removed");
	assertIsReg("dest2/file2", -1);
}